

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O3

void __thiscall QCborStreamWriter::append(QCborStreamWriter *this,QCborSimpleType st)

{
  _Head_base<0UL,_QCborStreamWriterPrivate_*,_false> _Var1;
  size_t sVar2;
  uint8_t *__n;
  QIODevice *this_00;
  long lVar3;
  long in_FS_OFFSET;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (this->d)._M_t.
       super___uniq_ptr_impl<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QCborStreamWriterPrivate_*,_std::default_delete<QCborStreamWriterPrivate>_>
       .super__Head_base<0UL,_QCborStreamWriterPrivate_*,_false>._M_head_impl;
  sVar2 = *(size_t *)((long)&(_Var1._M_head_impl)->encoder + 0x10);
  if (sVar2 != 0) {
    *(size_t *)((long)&(_Var1._M_head_impl)->encoder + 0x10) = sVar2 - 1;
  }
  if (st < 0x18) {
    lVar3 = (long)&local_10 + 7;
    local_10 = (ulong)st << 0x38 | 0xe000000000000000;
  }
  else {
    lVar3 = (long)&local_10 + 6;
    local_10 = CONCAT17(st,0xf8000000000000);
  }
  __n = *(uint8_t **)((long)&(_Var1._M_head_impl)->encoder + 8);
  this_00 = *(QIODevice **)__n;
  if (this_00 != (QIODevice *)0x0) {
    QIODevice::write(this_00,(int)lVar3,(void *)((long)&local_8 - lVar3),(size_t)__n);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCborStreamWriter::append(QCborSimpleType st)
{
    d->executeAppend(cbor_encode_simple_value, uint8_t(st));
}